

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O3

bool __thiscall DIS::AggregateMarking::operator==(AggregateMarking *this,AggregateMarking *rhs)

{
  uchar idx;
  long lVar1;
  bool bVar2;
  
  bVar2 = this->_characterSet == rhs->_characterSet;
  lVar1 = 0;
  do {
    bVar2 = (bool)(bVar2 & this->_characters[lVar1] == rhs->_characters[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1f);
  return bVar2;
}

Assistant:

bool AggregateMarking::operator ==(const AggregateMarking& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_characterSet == rhs._characterSet) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 31; idx++)
     {
          if(!(_characters[idx] == rhs._characters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }